

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

void Sfm_CreateFanout(Vec_Wec_t *vFanins,Vec_Wec_t *vFanouts)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = vFanins->nSize;
  iVar5 = vFanouts->nCap;
  if (iVar5 < iVar4) {
    if (vFanouts->pArray == (Vec_Int_t *)0x0) {
      pVVar2 = (Vec_Int_t *)malloc((long)iVar4 << 4);
    }
    else {
      pVVar2 = (Vec_Int_t *)realloc(vFanouts->pArray,(long)iVar4 << 4);
      iVar5 = vFanouts->nCap;
    }
    vFanouts->pArray = pVVar2;
    memset(pVVar2 + iVar5,0,(long)(iVar4 - iVar5) << 4);
    vFanouts->nCap = iVar4;
  }
  vFanouts->nSize = iVar4;
  for (iVar4 = 0; iVar4 < vFanins->nSize; iVar4 = iVar4 + 1) {
    pVVar2 = Vec_WecEntry(vFanins,iVar4);
    for (iVar5 = 0; iVar5 < pVVar2->nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(pVVar2,iVar5);
      pVVar3 = Vec_WecEntry(vFanouts,iVar1);
      pVVar3->nSize = pVVar3->nSize + 1;
    }
  }
  for (iVar4 = 0; iVar4 < vFanouts->nSize; iVar4 = iVar4 + 1) {
    pVVar2 = Vec_WecEntry(vFanouts,iVar4);
    iVar5 = pVVar2->nSize;
    pVVar2->nSize = 0;
    Vec_IntGrow(pVVar2,iVar5);
  }
  for (iVar4 = 0; iVar4 < vFanins->nSize; iVar4 = iVar4 + 1) {
    pVVar2 = Vec_WecEntry(vFanins,iVar4);
    for (iVar5 = 0; iVar5 < pVVar2->nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(pVVar2,iVar5);
      pVVar3 = Vec_WecEntry(vFanouts,iVar1);
      Vec_IntPush(pVVar3,iVar4);
    }
  }
  iVar4 = 0;
  do {
    if (vFanouts->nSize <= iVar4) {
      return;
    }
    pVVar2 = Vec_WecEntry(vFanouts,iVar4);
    iVar4 = iVar4 + 1;
  } while (pVVar2->nSize == pVVar2->nCap);
  __assert_fail("Vec_IntSize(vArray) == Vec_IntCap(vArray)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                ,0x61,"void Sfm_CreateFanout(Vec_Wec_t *, Vec_Wec_t *)");
}

Assistant:

void Sfm_CreateFanout( Vec_Wec_t * vFanins, Vec_Wec_t * vFanouts )
{
    Vec_Int_t * vArray;
    int i, k, Fanin;
    // count fanouts
    Vec_WecInit( vFanouts, Vec_WecSize(vFanins) );
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntForEachEntry( vArray, Fanin, k )
            Vec_WecEntry( vFanouts, Fanin )->nSize++;
    // allocate fanins
    Vec_WecForEachLevel( vFanouts, vArray, i )
    {
        k = vArray->nSize; vArray->nSize = 0;
        Vec_IntGrow( vArray, k );
    }
    // add fanouts
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntForEachEntry( vArray, Fanin, k )
            Vec_IntPush( Vec_WecEntry( vFanouts, Fanin ), i );
    // verify
    Vec_WecForEachLevel( vFanouts, vArray, i )
        assert( Vec_IntSize(vArray) == Vec_IntCap(vArray) );
}